

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,HighsVarType *data0,
                HighsVarType *sorted_data0)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if (0 < num_entries) {
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(ulong)(num_entries + 1),(allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector(&local_60,(ulong)(num_entries + 1),&local_61);
    piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar1 = (set->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar4 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 + 1] = piVar1[uVar4];
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 + 1] = (HighsInt)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uint)num_entries != uVar4);
    maxheapsort(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,num_entries);
    piVar1 = (set->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar4 = 1;
    if (1 < num_entries) {
      uVar4 = (ulong)(uint)num_entries;
    }
    uVar5 = 0;
    do {
      piVar1[uVar5] = piVar3[uVar5 + 1];
      if (data0 != (HighsVarType *)0x0) {
        sorted_data0[uVar5] = data0[piVar2[uVar5 + 1]];
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (HighsInt *)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (HighsInt *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const HighsVarType* data0, HighsVarType* sorted_data0) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
  }
}